

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hamt_map.cpp
# Opt level: O2

void __thiscall
InvalidIndex_InsertIntoIndexAtWrongRevision_Test::TestBody
          (InvalidIndex_InsertIntoIndexAtWrongRevision_Test *this)

{
  database *db;
  bool bVar1;
  pointer *__ptr;
  undefined1 *__m;
  AssertHelper aAStack_2d8 [2];
  AssertionResult gtest_ar;
  extent<char> local_298;
  undefined8 local_288;
  undefined8 uStack_280;
  shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  r0index;
  shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  r1index;
  transaction_type t2;
  transaction_type t1;
  unique_ptr<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
  local_120 [2];
  pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
  local_110;
  
  db = &(this->super_InvalidIndex).super_IndexFixture.db_;
  __m = &(this->super_InvalidIndex).super_IndexFixture.field_0x10;
  std::unique_lock<mock_mutex>::unique_lock((unique_lock<mock_mutex> *)&t2,(mutex_type *)__m);
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction(&t1,db,(lock_type *)&t2);
  std::unique_lock<mock_mutex>::~unique_lock((unique_lock<mock_mutex> *)&t2);
  pstore::index::
  get_index<(pstore::trailer::indices)5,pstore::database,pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>>
            ((index *)&r1index,db,true);
  s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&t2,"key1",4);
  local_298.addr.a_.a_ = (address)0;
  local_298.size = 0;
  pstore::index::
  hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>
  ::insert_or_assign<std::__cxx11::string,pstore::extent<char>,void>
            (&local_110,
             (hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>
              *)r1index.
                super___shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr,&t1.super_transaction_base,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&t2,&local_298);
  std::
  unique_ptr<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
  ::~unique_ptr(&local_110.first.pos_);
  std::__cxx11::string::~string((string *)&t2);
  pstore::transaction_base::commit(&t1.super_transaction_base);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&r1index.
              super___shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  pstore::transaction<std::unique_lock<mock_mutex>_>::~transaction(&t1);
  pstore::database::sync(db);
  pstore::index::
  get_index<(pstore::trailer::indices)5,pstore::database,pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>>
            ((index *)&r0index,db,true);
  std::unique_lock<mock_mutex>::unique_lock((unique_lock<mock_mutex> *)&t1,(mutex_type *)__m);
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction(&t2,db,(lock_type *)&t1);
  std::unique_lock<mock_mutex>::~unique_lock((unique_lock<mock_mutex> *)&t1);
  pstore::get_error_category();
  local_298.addr.a_.a_ = (address)&local_288;
  local_288 = 0;
  uStack_280 = 0;
  local_298.size = 0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&r1index,
                 "key2",4);
    gtest_ar.success_ = false;
    gtest_ar._1_7_ = 0;
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    pstore::index::
    hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>
    ::insert_or_assign<std::__cxx11::string,pstore::extent<char>,void>
              ((pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
                *)&t1,(hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>
                       *)r0index.
                         super___shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr,&t2.super_transaction_base,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&r1index,
               (extent<char> *)&gtest_ar);
    std::
    unique_ptr<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
    ::~unique_ptr(local_120);
    std::__cxx11::string::~string((string *)&r1index);
  }
  std::__cxx11::string::assign((char *)&local_298);
  testing::Message::Message((Message *)&gtest_ar);
  testing::internal::AssertHelper::AssertHelper
            (aAStack_2d8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/common/check_for_error.hpp"
             ,0x28,(char *)local_298.addr.a_.a_);
  testing::internal::AssertHelper::operator=(aAStack_2d8,(Message *)&gtest_ar);
  testing::internal::AssertHelper::~AssertHelper(aAStack_2d8);
  if (gtest_ar._0_8_ != 0) {
    (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
  }
  std::__cxx11::string::~string((string *)&local_298);
  pstore::transaction<std::unique_lock<mock_mutex>_>::~transaction(&t2);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&r0index.
              super___shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

TEST_F (InvalidIndex, InsertIntoIndexAtWrongRevision) {
    {
        transaction_type t1 = begin (db_, lock_guard{mutex_});
        auto r1index = pstore::index::get_index<pstore::trailer::indices::write> (db_);
        r1index->insert_or_assign (t1, "key1"s, pstore::extent<char> ());
        t1.commit ();
    }
    db_.sync (0);
    auto r0index = pstore::index::get_index<pstore::trailer::indices::write> (db_);
    {
        transaction_type t2 = begin (db_, lock_guard{mutex_});

        // We're now synced to revision 1. Trying to insert into the index loaded from
        // r0 should raise an error.
        check_for_error (
            [&] () { r0index->insert_or_assign (t2, "key2"s, pstore::extent<char> ()); },
            pstore::error_code::index_not_latest_revision);
    }
}